

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O2

string * __thiscall
util::make_string<char_const(&)[22],unsigned_char&,char_const(&)[12],unsigned_char&>
          (string *__return_storage_ptr__,util *this,char (*args) [22],uchar *args_1,
          char (*args_2) [12],uchar *args_3)

{
  ostringstream ss;
  ostringstream aoStack_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream(aoStack_1a8);
  std::operator<<((ostream *)aoStack_1a8,(char *)this);
  operator<<((ostream *)aoStack_1a8,(*args)[0]);
  std::operator<<((ostream *)aoStack_1a8,(char *)args_1);
  operator<<((ostream *)aoStack_1a8,(*args_2)[0]);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(aoStack_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string make_string(Args&& ... args)
{
    std::ostringstream ss;
    (void)std::initializer_list<bool> {(ss << args, false)...};
    return ss.str();
}